

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

bool __thiscall el::base::VRegistry::allowed(VRegistry *this,VerboseLevel vlevel,char *file)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  char *pattern;
  pointer ppVar3;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_true>
  local_e0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_true>
  local_d8;
  iterator it;
  allocator local_b9;
  string local_b8;
  char acStack_98 [8];
  char baseFilename [100];
  ScopedLock scopedLock;
  char *file_local;
  VerboseLevel vlevel_local;
  VRegistry *this_local;
  
  iVar2 = (*(this->super_ThreadSafe)._vptr_ThreadSafe[2])();
  threading::internal::NoScopedLock<el::base::threading::internal::NoMutex>::NoScopedLock
            ((NoScopedLock<el::base::threading::internal::NoMutex> *)(baseFilename + 0x60),
             (NoMutex *)CONCAT44(extraout_var,iVar2));
  bVar1 = utils::std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
          ::empty(&this->m_modules);
  if ((bVar1) || (file == (char *)0x0)) {
    this_local._7_1_ = vlevel <= *(ushort *)&(this->super_ThreadSafe).field_0xa;
  }
  else {
    baseFilename[0x48] = '\0';
    baseFilename[0x49] = '\0';
    baseFilename[0x4a] = '\0';
    baseFilename[0x4b] = '\0';
    baseFilename[0x4c] = '\0';
    baseFilename[0x4d] = '\0';
    baseFilename[0x4e] = '\0';
    baseFilename[0x4f] = '\0';
    baseFilename[0x50] = '\0';
    baseFilename[0x51] = '\0';
    baseFilename[0x52] = '\0';
    baseFilename[0x53] = '\0';
    baseFilename[0x54] = '\0';
    baseFilename[0x55] = '\0';
    baseFilename[0x56] = '\0';
    baseFilename[0x57] = '\0';
    baseFilename[0x38] = '\0';
    baseFilename[0x39] = '\0';
    baseFilename[0x3a] = '\0';
    baseFilename[0x3b] = '\0';
    baseFilename[0x3c] = '\0';
    baseFilename[0x3d] = '\0';
    baseFilename[0x3e] = '\0';
    baseFilename[0x3f] = '\0';
    baseFilename[0x40] = '\0';
    baseFilename[0x41] = '\0';
    baseFilename[0x42] = '\0';
    baseFilename[0x43] = '\0';
    baseFilename[0x44] = '\0';
    baseFilename[0x45] = '\0';
    baseFilename[0x46] = '\0';
    baseFilename[0x47] = '\0';
    baseFilename[0x28] = '\0';
    baseFilename[0x29] = '\0';
    baseFilename[0x2a] = '\0';
    baseFilename[0x2b] = '\0';
    baseFilename[0x2c] = '\0';
    baseFilename[0x2d] = '\0';
    baseFilename[0x2e] = '\0';
    baseFilename[0x2f] = '\0';
    baseFilename[0x30] = '\0';
    baseFilename[0x31] = '\0';
    baseFilename[0x32] = '\0';
    baseFilename[0x33] = '\0';
    baseFilename[0x34] = '\0';
    baseFilename[0x35] = '\0';
    baseFilename[0x36] = '\0';
    baseFilename[0x37] = '\0';
    baseFilename[0x18] = '\0';
    baseFilename[0x19] = '\0';
    baseFilename[0x1a] = '\0';
    baseFilename[0x1b] = '\0';
    baseFilename[0x1c] = '\0';
    baseFilename[0x1d] = '\0';
    baseFilename[0x1e] = '\0';
    baseFilename[0x1f] = '\0';
    baseFilename[0x20] = '\0';
    baseFilename[0x21] = '\0';
    baseFilename[0x22] = '\0';
    baseFilename[0x23] = '\0';
    baseFilename[0x24] = '\0';
    baseFilename[0x25] = '\0';
    baseFilename[0x26] = '\0';
    baseFilename[0x27] = '\0';
    baseFilename[8] = '\0';
    baseFilename[9] = '\0';
    baseFilename[10] = '\0';
    baseFilename[0xb] = '\0';
    baseFilename[0xc] = '\0';
    baseFilename[0xd] = '\0';
    baseFilename[0xe] = '\0';
    baseFilename[0xf] = '\0';
    baseFilename[0x10] = '\0';
    baseFilename[0x11] = '\0';
    baseFilename[0x12] = '\0';
    baseFilename[0x13] = '\0';
    baseFilename[0x14] = '\0';
    baseFilename[0x15] = '\0';
    baseFilename[0x16] = '\0';
    baseFilename[0x17] = '\0';
    acStack_98[0] = '\0';
    acStack_98[1] = '\0';
    acStack_98[2] = '\0';
    acStack_98[3] = '\0';
    acStack_98[4] = '\0';
    acStack_98[5] = '\0';
    acStack_98[6] = '\0';
    acStack_98[7] = '\0';
    baseFilename[0] = '\0';
    baseFilename[1] = '\0';
    baseFilename[2] = '\0';
    baseFilename[3] = '\0';
    baseFilename[4] = '\0';
    baseFilename[5] = '\0';
    baseFilename[6] = '\0';
    baseFilename[7] = '\0';
    baseFilename[0x58] = '\0';
    baseFilename[0x59] = '\0';
    baseFilename[0x5a] = '\0';
    baseFilename[0x5b] = '\0';
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_b8,file,&local_b9);
    utils::File::buildBaseFilename(&local_b8,acStack_98,100,consts::kFilePathSeperator);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    local_d8._M_cur =
         (__node_type *)
         utils::std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
         ::begin(&this->m_modules);
    while( true ) {
      local_e0._M_cur =
           (__node_type *)
           utils::std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
           ::end(&this->m_modules);
      bVar1 = utils::std::__detail::operator!=(&local_d8,&local_e0);
      if (!bVar1) break;
      utils::std::__detail::
      _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_false,_true>
      ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_false,_true>
                    *)&local_d8);
      pattern = (char *)std::__cxx11::string::c_str();
      bVar1 = utils::Str::wildCardMatch(acStack_98,pattern);
      if (bVar1) {
        ppVar3 = utils::std::__detail::
                 _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_false,_true>
                 ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_false,_true>
                               *)&local_d8);
        this_local._7_1_ = vlevel <= ppVar3->second;
        goto LAB_00126ec4;
      }
      utils::std::__detail::
      _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_false,_true>
      ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_false,_true>
                    *)&local_d8);
    }
    bVar1 = utils::hasFlag<el::LoggingFlag>(AllowVerboseIfModuleNotSpecified,*this->m_pFlags);
    if (bVar1) {
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
LAB_00126ec4:
  baseFilename[0x5c] = '\x01';
  baseFilename[0x5d] = '\0';
  baseFilename[0x5e] = '\0';
  baseFilename[0x5f] = '\0';
  threading::internal::NoScopedLock<el::base::threading::internal::NoMutex>::~NoScopedLock
            ((NoScopedLock<el::base::threading::internal::NoMutex> *)(baseFilename + 0x60));
  return this_local._7_1_;
}

Assistant:

bool VRegistry::allowed(base::type::VerboseLevel vlevel, const char* file) {
  base::threading::ScopedLock scopedLock(lock());
  if (m_modules.empty() || file == nullptr) {
    return vlevel <= m_level;
  } else {
    char baseFilename[base::consts::kSourceFilenameMaxLength] = "";
    base::utils::File::buildBaseFilename(file, baseFilename);
    std::unordered_map<std::string, base::type::VerboseLevel>::iterator it = m_modules.begin();
    for (; it != m_modules.end(); ++it) {
      if (base::utils::Str::wildCardMatch(baseFilename, it->first.c_str())) {
        return vlevel <= it->second;
      }
    }
    if (base::utils::hasFlag(LoggingFlag::AllowVerboseIfModuleNotSpecified, *m_pFlags)) {
      return true;
    }
    return false;
  }
}